

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::StartEnum(Parser *this,string *name,bool is_union,EnumDef **dest)

{
  bool bVar1;
  EnumDef *this_00;
  BaseType BVar2;
  undefined7 in_register_00000011;
  undefined8 *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string qualified_name;
  EnumDef *enum_def;
  EnumDef **dest_local;
  bool is_union_local;
  string *name_local;
  Parser *this_local;
  
  this_00 = (EnumDef *)operator_new(0x138);
  EnumDef::EnumDef(this_00);
  std::__cxx11::string::operator=
            ((string *)this_00,(string *)CONCAT71(in_register_00000011,is_union));
  std::__cxx11::string::operator=
            ((string *)&(this_00->super_Definition).file,(string *)&name[0x38]._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this_00->super_Definition).doc_comment,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name[2]._M_string_length);
  this_00->is_union = (bool)((byte)dest & 1);
  (this_00->super_Definition).defined_namespace = *(Namespace **)((long)&name[0xc].field_2 + 8);
  Namespace::GetFullyQualifiedName
            ((string *)local_68,*(Namespace **)((long)&name[0xc].field_2 + 8),
             (string *)CONCAT71(in_register_00000011,is_union),1000);
  bVar1 = SymbolTable<flatbuffers::EnumDef>::Add
                    ((SymbolTable<flatbuffers::EnumDef> *)&name[7].field_2,(string *)local_68,
                     this_00);
  if (bVar1) {
    std::operator+(&local_88,"enum already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    Error(this,name);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    BVar2 = BASE_TYPE_INT;
    if (((ulong)dest & 1) != 0) {
      BVar2 = BASE_TYPE_UTYPE;
    }
    (this_00->underlying_type).base_type = BVar2;
    (this_00->underlying_type).enum_def = this_00;
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = this_00;
    }
    anon_unknown_0::NoError();
  }
  std::__cxx11::string::~string((string *)local_68);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartEnum(const std::string &name, bool is_union,
                               EnumDef **dest) {
  auto &enum_def = *new EnumDef();
  enum_def.name = name;
  enum_def.file = file_being_parsed_;
  enum_def.doc_comment = doc_comment_;
  enum_def.is_union = is_union;
  enum_def.defined_namespace = current_namespace_;
  const auto qualified_name = current_namespace_->GetFullyQualifiedName(name);
  if (enums_.Add(qualified_name, &enum_def))
    return Error("enum already exists: " + qualified_name);
  enum_def.underlying_type.base_type =
      is_union ? BASE_TYPE_UTYPE : BASE_TYPE_INT;
  enum_def.underlying_type.enum_def = &enum_def;
  if (dest) *dest = &enum_def;
  return NoError();
}